

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
WrongSignature<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::TestBody
          (WrongSignature<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this)

{
  WrongSignature<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate> *this_local;
  
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-wrong-signature/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-and-target-wrong-signature/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"incorrect-trust-anchor/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"target-wrong-signature-no-authority-key-identifier/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>::
  RunTest((VerifyCertificateChainTest<bssl::(anonymous_namespace)::VerifyCertificateChainTestDelegate>
           *)this,"intermediate-wrong-signature-no-authority-key-identifier/main.test");
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, WrongSignature) {
  this->RunTest("target-wrong-signature/main.test");
  this->RunTest("intermediate-and-target-wrong-signature/main.test");
  this->RunTest("incorrect-trust-anchor/main.test");
  this->RunTest("target-wrong-signature-no-authority-key-identifier/main.test");
  this->RunTest(
      "intermediate-wrong-signature-no-authority-key-identifier/main.test");
}